

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O2

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:253:34)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:253:34)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *pPVar1;
  TutorialApplication *pTVar2;
  
  pPVar1 = cin->ptr;
  if (pPVar1 == (ParseStream *)0x0) {
    pTVar2 = (this->f).this;
    pTVar2->iflags_coherent = RTC_RAY_QUERY_FLAG_INCOHERENT;
    g_iflags_coherent = RTC_RAY_QUERY_FLAG_INCOHERENT;
    pTVar2->iflags_incoherent = RTC_RAY_QUERY_FLAG_INCOHERENT;
    g_iflags_incoherent = RTC_RAY_QUERY_FLAG_INCOHERENT;
  }
  else {
    (*(pPVar1->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(pPVar1);
    pTVar2 = (this->f).this;
    pTVar2->iflags_coherent = RTC_RAY_QUERY_FLAG_INCOHERENT;
    g_iflags_coherent = RTC_RAY_QUERY_FLAG_INCOHERENT;
    pTVar2->iflags_incoherent = RTC_RAY_QUERY_FLAG_INCOHERENT;
    g_iflags_incoherent = RTC_RAY_QUERY_FLAG_INCOHERENT;
    (*(pPVar1->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[3])(pPVar1);
  }
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }